

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O3

bool common::FeeModeFromString(string *mode_string,FeeEstimateMode *fee_estimate_mode)

{
  pointer ppVar1;
  _Alloc_hider _Var2;
  int iVar3;
  pointer ppVar4;
  FeeEstimateMode *pFVar5;
  long in_FS_OFFSET;
  bool bVar6;
  string_view str;
  string_view str_00;
  string searchkey;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (mode_string->_M_dataplus)._M_p;
  str._M_len = mode_string->_M_string_length;
  ToUpper_abi_cxx11_(&local_58,str);
  FeeModeMap_abi_cxx11_();
  ppVar1 = FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pFVar5 = &(FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second;
    do {
      str_00._M_str =
           (((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>
              *)(pFVar5 + -8))->first)._M_dataplus._M_p;
      str_00._M_len = *(size_type *)(pFVar5 + -6);
      ToUpper_abi_cxx11_(&local_78,str_00);
      _Var2._M_p = local_78._M_dataplus._M_p;
      if (local_78._M_string_length == local_58._M_string_length) {
        if (local_78._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp(local_78._M_dataplus._M_p,local_58._M_dataplus._M_p,local_78._M_string_length
                      );
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_78.field_2) {
        operator_delete(_Var2._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        *fee_estimate_mode = *pFVar5;
        bVar6 = true;
        goto LAB_0033d6d6;
      }
      ppVar4 = (pointer)(pFVar5 + 2);
      pFVar5 = pFVar5 + 10;
    } while (ppVar4 != ppVar1);
  }
  bVar6 = false;
LAB_0033d6d6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool FeeModeFromString(const std::string& mode_string, FeeEstimateMode& fee_estimate_mode)
{
    auto searchkey = ToUpper(mode_string);
    for (const auto& pair : FeeModeMap()) {
        if (ToUpper(pair.first) == searchkey) {
            fee_estimate_mode = pair.second;
            return true;
        }
    }
    return false;
}